

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O3

bool ctemplate::HasTemplateChangedOnDisk(char *resolved_filename,time_t mtime,FileStat *statbuf)

{
  __off_t _Var1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  allocator local_49;
  char *local_48 [2];
  char local_38 [16];
  
  std::__cxx11::string::string((string *)local_48,resolved_filename,&local_49);
  iVar3 = stat(local_48[0],(stat *)&statbuf->internal_statbuf);
  if (iVar3 == 0) {
    _Var1 = (statbuf->internal_statbuf).st_size;
    statbuf->mtime = (statbuf->internal_statbuf).st_mtim.tv_sec;
    statbuf->length = _Var1;
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if (iVar3 == 0) {
    bVar2 = mtime < 1 || statbuf->mtime != mtime;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"WARNING: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to stat file ",0x14);
    if (resolved_filename == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x150350);
    }
    else {
      sVar4 = strlen(resolved_filename);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,resolved_filename,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'P');
    std::ostream::put('P');
    std::ostream::flush();
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool HasTemplateChangedOnDisk(const char* resolved_filename,
                              time_t mtime,
                              FileStat* statbuf) {
  if (!File::Stat(resolved_filename, statbuf)) {
    LOG(WARNING) << "Unable to stat file " << resolved_filename << endl;
    // If we can't Stat the file then the file may have been deleted,
    // so reload the template.
    return true;
  }
  if (statbuf->mtime == mtime && mtime > 0) {
    // No need to reload yet.
    return false;
  }
  return true;
}